

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O1

GLvoid __thiscall
gl4cts::anon_unknown_0::GatherBase::CreateTexture2DRgb(GatherBase *this,bool base_level)

{
  CallLogWrapper *this_00;
  int i;
  long lVar1;
  undefined7 in_register_00000031;
  size_type __n;
  uint uVar2;
  uint width;
  int level;
  bool bVar3;
  allocator_type local_81;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> pixels;
  Vec3 data [4];
  
  width = (int)CONCAT71(in_register_00000031,base_level) * 0x20 + 0x20;
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->tex);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->tex);
  level = 0;
  uVar2 = width;
  do {
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,level,0x8815,uVar2,uVar2,0,0x1907,0x1406,(void *)0x0);
    level = level + 1;
    bVar3 = 1 < uVar2;
    uVar2 = uVar2 >> 1;
  } while (bVar3);
  lVar1 = 0;
  do {
    data[0].m_data[lVar1] = 1.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  __n = 0x400;
  if (base_level) {
    __n = 0x1000;
  }
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&pixels,__n,data,&local_81);
  glu::CallLogWrapper::glTexSubImage2D
            (this_00,0xde1,0,0,0,width,width,0x1907,0x1406,
             pixels.
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glGenerateMipmap(this_00,0xde1);
  data[0].m_data[0] = 0.75;
  data[0].m_data[1] = 0.8125;
  data[0].m_data[2] = 0.875;
  data[1].m_data[0] = 0.5;
  data[1].m_data[1] = 0.5625;
  data[1].m_data[2] = 0.625;
  data[2].m_data[0] = 0.0;
  data[2].m_data[1] = 0.0625;
  data[2].m_data[2] = 0.125;
  data[3].m_data[0] = 0.25;
  data[3].m_data[1] = 0.3125;
  data[3].m_data[2] = 0.375;
  uVar2 = (uint)base_level;
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,uVar2,0x16,0x19,2,2,0x1907,0x1406,data);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,uVar2,0x10,10,1,1,0x1907,0x1406,data);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,uVar2,0xb,2,1,1,0x1907,0x1406,data + 1);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,uVar2,0x18,0xd,1,1,0x1907,0x1406,data + 2);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,uVar2,9,0xe,1,1,0x1907,0x1406,data + 3);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x8072,0x812f);
  if (pixels.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pixels.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pixels.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pixels.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

virtual GLvoid CreateTexture2DRgb(bool base_level = false)
	{
		GLenum		internal_format = GL_RGB32F;
		GLenum		format			= GL_RGB;
		const GLint csize			= base_level ? 64 : 32;
		GLint		size			= csize;
		GLenum		target			= GL_TEXTURE_2D;
		GLenum		tex_type		= GL_FLOAT;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			glTexImage2D(target, i, internal_format, size, size, 0, format, tex_type, 0);
		}
		std::vector<Vec3> pixels(csize * csize, Vec3(1.0));
		glTexSubImage2D(target, 0, 0, 0, csize, csize, format, tex_type, &pixels[0]);
		glGenerateMipmap(target);

		Vec3 data[4] = { Vec3(12. / 16, 13. / 16, 14. / 16), Vec3(8. / 16, 9. / 16, 10. / 16),
						 Vec3(0. / 16, 1. / 16, 2. / 16), Vec3(4. / 16, 5. / 16, 6. / 16) };

		glTexSubImage2D(target, base_level, 22, 25, 2, 2, format, tex_type, data);
		glTexSubImage2D(target, base_level, 16, 10, 1, 1, format, tex_type, data + 0);
		glTexSubImage2D(target, base_level, 11, 2, 1, 1, format, tex_type, data + 1);
		glTexSubImage2D(target, base_level, 24, 13, 1, 1, format, tex_type, data + 2);
		glTexSubImage2D(target, base_level, 9, 14, 1, 1, format, tex_type, data + 3);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
	}